

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::SuperNewDefaultedArgsExpressionSyntax::setChild
          (SuperNewDefaultedArgsExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0046ceb0 + *(int *)(&DAT_0046ceb0 + index * 4)))();
  return;
}

Assistant:

void SuperNewDefaultedArgsExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: scopedNew = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: openParen = child.token(); return;
        case 2: defaultKeyword = child.token(); return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}